

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreeCloseCursor(BtCursor *pCur)

{
  int *piVar1;
  Btree *p;
  BtCursor *pBVar2;
  BtCursor *pBVar3;
  int in_EAX;
  int extraout_EAX;
  BtShared *pBVar4;
  BtCursor *pBVar5;
  long lVar6;
  
  p = pCur->pBtree;
  if (p != (Btree *)0x0) {
    pBVar2 = (BtCursor *)pCur->pBt;
    sqlite3BtreeEnter(p);
    sqlite3_free(pCur->pKey);
    pCur->pKey = (void *)0x0;
    pCur->eState = '\0';
    pBVar3 = pCur->pPrev;
    pBVar5 = pBVar3;
    if (pBVar3 == (BtCursor *)0x0) {
      pBVar5 = pBVar2;
    }
    pBVar5->pNext = pCur->pNext;
    if (pCur->pNext != (BtCursor *)0x0) {
      pCur->pNext->pPrev = pBVar3;
    }
    if (-1 < pCur->iPage) {
      lVar6 = -1;
      do {
        if (pCur->apPage[lVar6 + 1] != (MemPage *)0x0) {
          sqlite3PagerUnref(pCur->apPage[lVar6 + 1]->pDbPage);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < pCur->iPage);
    }
    if ((*(u8 *)((long)&pBVar2->pKeyInfo + 4) == '\0') && (pBVar2->pPrev != (BtCursor *)0x0)) {
      sqlite3PagerUnref((DbPage *)pBVar2->pPrev->pKey);
      pBVar2->pPrev = (BtCursor *)0x0;
    }
    sqlite3_free(pCur->aOverflow);
    pCur->aOverflow = (Pgno *)0x0;
    in_EAX = extraout_EAX;
    if (p->sharable != '\0') {
      piVar1 = &p->wantToLock;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        pBVar4 = p->pBt;
        if (pBVar4->mutex != (sqlite3_mutex *)0x0) {
          pBVar4 = (BtShared *)(*sqlite3Config.mutex.xMutexLeave)(pBVar4->mutex);
        }
        in_EAX = (int)pBVar4;
        p->locked = '\0';
      }
    }
  }
  return in_EAX;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeCloseCursor(BtCursor *pCur){
  Btree *pBtree = pCur->pBtree;
  if( pBtree ){
    int i;
    BtShared *pBt = pCur->pBt;
    sqlite3BtreeEnter(pBtree);
    sqlite3BtreeClearCursor(pCur);
    if( pCur->pPrev ){
      pCur->pPrev->pNext = pCur->pNext;
    }else{
      pBt->pCursor = pCur->pNext;
    }
    if( pCur->pNext ){
      pCur->pNext->pPrev = pCur->pPrev;
    }
    for(i=0; i<=pCur->iPage; i++){
      releasePage(pCur->apPage[i]);
    }
    unlockBtreeIfUnused(pBt);
    invalidateOverflowCache(pCur);
    /* sqlite3_free(pCur); */
    sqlite3BtreeLeave(pBtree);
  }
  return SQLITE_OK;
}